

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# amapMerge.c
# Opt level: O1

int Amap_ManFindCut(Amap_Obj_t *pNode,Amap_Obj_t *pFanin,int fComplFanin,int Val,Vec_Ptr_t *vCuts)

{
  void **ppvVar1;
  int iVar2;
  uint uVar3;
  uint *puVar4;
  uint uVar5;
  
  vCuts->nSize = 0;
  if (0xfff < *(uint *)&pFanin->field_0x8) {
    puVar4 = (uint *)(pFanin->field_11).pData;
    uVar5 = 0;
    do {
      iVar2 = 0;
      uVar3 = *puVar4 & 0xffff;
      if (uVar3 != 0) {
        if (1 < (uint)fComplFanin) {
          __assert_fail("Var >= 0 && !(c >> 1)",
                        "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/misc/util/abc_global.h"
                        ,0xf1,"int Abc_Var2Lit(int, int)");
        }
        iVar2 = (*puVar4 >> 0x10 & 1 ^ fComplFanin) + uVar3 * 2;
      }
      if (iVar2 == Val) {
        uVar3 = vCuts->nCap;
        if (vCuts->nSize == uVar3) {
          if ((int)uVar3 < 0x10) {
            if (vCuts->pArray == (void **)0x0) {
              ppvVar1 = (void **)malloc(0x80);
            }
            else {
              ppvVar1 = (void **)realloc(vCuts->pArray,0x80);
            }
            vCuts->pArray = ppvVar1;
            iVar2 = 0x10;
          }
          else {
            iVar2 = uVar3 * 2;
            if (iVar2 <= (int)uVar3) goto LAB_003c754b;
            if (vCuts->pArray == (void **)0x0) {
              ppvVar1 = (void **)malloc((ulong)uVar3 << 4);
            }
            else {
              ppvVar1 = (void **)realloc(vCuts->pArray,(ulong)uVar3 << 4);
            }
            vCuts->pArray = ppvVar1;
          }
          vCuts->nCap = iVar2;
        }
LAB_003c754b:
        iVar2 = vCuts->nSize;
        vCuts->nSize = iVar2 + 1;
        vCuts->pArray[iVar2] = puVar4;
      }
      uVar5 = uVar5 + 1;
      puVar4 = puVar4 + (ulong)(*puVar4 >> 0x11) + 1;
    } while (uVar5 < *(uint *)&pFanin->field_0x8 >> 0xc);
  }
  return (int)(vCuts->nSize == 0);
}

Assistant:

int Amap_ManFindCut( Amap_Obj_t * pNode, Amap_Obj_t * pFanin, int fComplFanin, int Val, Vec_Ptr_t * vCuts )
{
    Amap_Cut_t * pCut;
    int c, iCompl, iFan;
    Vec_PtrClear( vCuts );
    Amap_NodeForEachCut( pFanin, pCut, c )
    {
        iCompl = pCut->fInv ^ fComplFanin;
        iFan   = !pCut->iMat? 0: Abc_Var2Lit( pCut->iMat, iCompl );
        if ( iFan == Val )
            Vec_PtrPush( vCuts, pCut );
    }
    return Vec_PtrSize(vCuts) == 0;
}